

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

void rec_varg(jit_State *J,BCReg dst,ptrdiff_t nresults)

{
  TValue *pTVar1;
  IRRef1 IVar2;
  uint uVar3;
  TRef TVar4;
  TRef TVar5;
  int iVar6;
  int32_t iVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  long in_RDX;
  uint in_ESI;
  jit_State *in_RDI;
  TRef vbase_1;
  TRef aref_1;
  IRType t_1;
  TRef tmp2;
  TRef tmp_1;
  TRef tmp;
  ptrdiff_t idx;
  TRef tr_1;
  TRef tridx;
  TRef tr;
  TRef aref;
  IRType t;
  TRef vbase;
  ptrdiff_t nload;
  ptrdiff_t i_1;
  int32_t frofs;
  TRef fr;
  ptrdiff_t i;
  ptrdiff_t nvararg;
  int32_t numparams;
  undefined8 in_stack_fffffffffffffd28;
  TraceError e;
  undefined6 in_stack_fffffffffffffd30;
  undefined2 in_stack_fffffffffffffd36;
  jit_State *in_stack_fffffffffffffd38;
  undefined6 in_stack_fffffffffffffd40;
  IRRef1 in_stack_fffffffffffffd46;
  jit_State *in_stack_fffffffffffffd48;
  jit_State *pjVar11;
  TValue *in_stack_fffffffffffffd58;
  uint32_t asize;
  TRef in_stack_fffffffffffffd60;
  undefined2 uVar12;
  TRef in_stack_fffffffffffffd64;
  jit_State *in_stack_fffffffffffffd68;
  uint local_26c;
  TRef local_210;
  TRef local_20c;
  IRRef1 local_1f8;
  TRef local_1e8;
  uint local_1e4;
  TRef local_1e0;
  long local_1c8;
  long local_1b8;
  long local_1b0;
  long local_1a0;
  uint local_1c;
  uint local_10;
  
  uVar3 = (uint)in_RDI->pt->numparams;
  local_1b0 = (((long)*(int *)((long)in_RDI->L->base + -4) >> 3) - (long)(int)uVar3) + -1;
  e = (TraceError)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  if (in_RDI->framedepth < 1) {
    (in_RDI->fold).ins.field_0.ot = 0x4613;
    (in_RDI->fold).ins.field_0.op1 = 0;
    (in_RDI->fold).ins.field_0.op2 = 0x12;
    TVar4 = lj_opt_fold(in_stack_fffffffffffffd38);
    IVar2 = (IRRef1)TVar4;
    if (in_RDX < 0) {
      iVar6 = select_detect(in_stack_fffffffffffffd48);
      if (iVar6 != 0) {
        if (in_RDI->base[in_ESI - 1] == 0) {
          local_26c = sload((jit_State *)
                            CONCAT26(in_stack_fffffffffffffd36,in_stack_fffffffffffffd30),e);
        }
        else {
          local_26c = in_RDI->base[in_ESI - 1];
        }
        local_1e4 = local_26c;
        uVar8 = local_1e4;
        local_1e4._0_2_ = (IRRef1)local_26c;
        local_1e8 = 0x7fff;
        iVar7 = lj_ffrecord_select_mode
                          (in_stack_fffffffffffffd68,in_stack_fffffffffffffd64,
                           in_stack_fffffffffffffd58);
        uVar12 = (undefined2)in_stack_fffffffffffffd64;
        lVar9 = (long)iVar7;
        if (-1 < lVar9) {
          if ((lVar9 != 0) && (4 < (local_26c >> 0x18 & 0x1f) - 0xf)) {
            if ((local_26c & 0x1f000000) == 0x4000000) {
              (in_RDI->fold).ins.field_0.ot = 0x5c8e;
              (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_1e4;
              (in_RDI->fold).ins.field_0.op2 = 0;
              TVar4 = lj_opt_fold(in_stack_fffffffffffffd38);
              local_1e4._0_2_ = (IRRef1)TVar4;
            }
            (in_RDI->fold).ins.field_0.ot = 0x5993;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)local_1e4;
            (in_RDI->fold).ins.field_0.op2 = 0x226e;
            uVar8 = lj_opt_fold(in_stack_fffffffffffffd38);
          }
          local_1e4 = uVar8;
          iVar7 = (int32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20);
          if ((lVar9 == 0) || (0x7fff < (local_1e4 & 0xffff))) {
            if (local_1b0 < lVar9) {
              TVar4 = lj_ir_kint((jit_State *)
                                 CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),iVar7
                                );
              local_1f8 = (IRRef1)TVar4;
              if (lVar9 == 0) {
                local_1e8 = lj_ir_kint((jit_State *)
                                       CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)
                                       ,(int32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20));
              }
              else {
                in_stack_fffffffffffffd38 = in_RDI;
                in_stack_fffffffffffffd46 = (IRRef1)local_1e4;
                TVar4 = lj_ir_kint((jit_State *)
                                   CONCAT26((IRRef1)local_1e4,in_stack_fffffffffffffd40),
                                   (int32_t)((ulong)in_RDI >> 0x20));
                (in_stack_fffffffffffffd38->fold).ins.field_0.ot = 0x2413;
                (in_stack_fffffffffffffd38->fold).ins.field_0.op1 = in_stack_fffffffffffffd46;
                (in_stack_fffffffffffffd38->fold).ins.field_0.op2 = (IRRef1)TVar4;
                TVar4 = lj_opt_fold(in_stack_fffffffffffffd38);
                (in_RDI->fold).ins.field_0.ot = 0x2913;
                (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar4;
                (in_RDI->fold).ins.field_0.op2 = local_1f8;
                TVar4 = lj_opt_fold(in_stack_fffffffffffffd38);
                local_1f8 = (IRRef1)TVar4;
              }
              (in_RDI->fold).ins.field_0.ot = 0x93;
              (in_RDI->fold).ins.field_0.op1 = IVar2;
              (in_RDI->fold).ins.field_0.op2 = local_1f8;
              lj_opt_fold(in_stack_fffffffffffffd38);
            }
            else {
              TVar4 = lj_ir_kint((jit_State *)
                                 CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),iVar7
                                );
              (in_RDI->fold).ins.field_0.ot = 0x2913;
              (in_RDI->fold).ins.field_0.op1 = IVar2;
              (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
              TVar4 = lj_opt_fold(in_stack_fffffffffffffd38);
              if (uVar3 != 0) {
                in_stack_fffffffffffffd68 = in_RDI;
                TVar5 = lj_ir_kint((jit_State *)
                                   CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),
                                   (int32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20));
                (in_stack_fffffffffffffd68->fold).ins.field_0.ot = 0x193;
                (in_stack_fffffffffffffd68->fold).ins.field_0.op1 = (IRRef1)TVar4;
                (in_stack_fffffffffffffd68->fold).ins.field_0.op2 = (IRRef1)TVar5;
                lj_opt_fold(in_stack_fffffffffffffd38);
              }
              TVar5 = CONCAT22((IRRef1)TVar4,uVar12);
              pjVar11 = in_RDI;
              TVar4 = lj_ir_kint((jit_State *)
                                 CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),
                                 (int32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20));
              (pjVar11->fold).ins.field_0.ot = 0x2513;
              (pjVar11->fold).ins.field_0.op1 = (IRRef1)(TVar5 >> 0x10);
              (pjVar11->fold).ins.field_0.op2 = (IRRef1)TVar4;
              local_1e8 = lj_opt_fold(in_stack_fffffffffffffd38);
              asize = (uint32_t)((ulong)pjVar11 >> 0x20);
              if (lVar9 != 0) {
                pjVar11 = in_RDI;
                TVar4 = lj_ir_kint((jit_State *)
                                   CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),
                                   (int32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20));
                (pjVar11->fold).ins.field_0.ot = 0x2913;
                (pjVar11->fold).ins.field_0.op1 = (IRRef1)local_1e4;
                (pjVar11->fold).ins.field_0.op2 = (IRRef1)TVar4;
                TVar4 = lj_opt_fold(in_stack_fffffffffffffd38);
                local_1e4._0_2_ = (IRRef1)TVar4;
                rec_idx_abc(in_stack_fffffffffffffd68,TVar5,in_stack_fffffffffffffd60,asize);
              }
            }
          }
          else {
            TVar4 = lj_ir_kint((jit_State *)
                               CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),iVar7);
            (in_RDI->fold).ins.field_0.ot = (ushort)(lVar9 <= local_1b0) << 8 | 0x93;
            (in_RDI->fold).ins.field_0.op1 = IVar2;
            (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
            lj_opt_fold(in_stack_fffffffffffffd38);
          }
          if ((lVar9 != 0) && (lVar9 <= local_1b0)) {
            (in_RDI->fold).ins.field_0.ot = 0x2a13;
            (in_RDI->fold).ins.field_0.op1 = 0x8000;
            (in_RDI->fold).ins.field_0.op2 = IVar2;
            TVar4 = lj_opt_fold(in_stack_fffffffffffffd38);
            IVar2 = (IRRef1)TVar4;
            TVar4 = lj_ir_kint((jit_State *)
                               CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),
                               (int32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20));
            (in_RDI->fold).ins.field_0.ot = 0x2905;
            (in_RDI->fold).ins.field_0.op1 = IVar2;
            (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
            TVar4 = lj_opt_fold(in_stack_fffffffffffffd38);
            pTVar1 = in_RDI->L->base;
            local_1b0 = (lVar9 + -2) - local_1b0;
            if ((&pTVar1->field_2)[local_1b0].it < 0xfffeffff) {
              local_1c = 0xe;
            }
            else if ((int)(&pTVar1->field_2)[local_1b0].it >> 0xf == -2) {
              local_1c = 3;
            }
            else {
              local_1c = (&pTVar1->field_2)[local_1b0].it ^ 0xffffffff;
            }
            (in_RDI->fold).ins.field_0.ot = 0x3805;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar4;
            (in_RDI->fold).ins.field_0.op2 = (IRRef1)local_1e4;
            TVar4 = lj_opt_fold(in_stack_fffffffffffffd38);
            (in_RDI->fold).ins.field_0.ot = (ushort)local_1c | 0x4780;
            (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar4;
            (in_RDI->fold).ins.field_0.op2 = 0;
            local_1e8 = lj_opt_fold(in_stack_fffffffffffffd38);
            if (local_1c < 3) {
              local_1e8 = local_1c * 0xffffff + 0x7fff;
            }
          }
          in_RDI->base[in_ESI - 2] = local_1e8;
          in_RDI->maxslot = in_ESI - 1;
          in_RDI->bcskip = '\x02';
          return;
        }
      }
      (in_RDI->errinfo).u64 = 0x4051c00000000000;
      lj_trace_err_info((jit_State *)CONCAT26(in_stack_fffffffffffffd36,in_stack_fffffffffffffd30),e
                       );
    }
    iVar7 = (int32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20);
    if (local_1b0 < 1) {
      TVar4 = lj_ir_kint((jit_State *)CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),
                         iVar7);
      (in_RDI->fold).ins.field_0.ot = 0x293;
      (in_RDI->fold).ins.field_0.op1 = IVar2;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
      lj_opt_fold(in_stack_fffffffffffffd38);
      local_1b0 = 0;
    }
    else {
      if (local_1b0 < in_RDX) {
        TVar4 = lj_ir_kint((jit_State *)
                           CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),iVar7);
        (in_RDI->fold).ins.field_0.ot = 0x893;
        (in_RDI->fold).ins.field_0.op1 = IVar2;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
        lj_opt_fold(in_stack_fffffffffffffd38);
        lVar9 = local_1b0;
      }
      else {
        TVar4 = lj_ir_kint((jit_State *)
                           CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),iVar7);
        (in_RDI->fold).ins.field_0.ot = 0x193;
        (in_RDI->fold).ins.field_0.op1 = IVar2;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar4;
        lj_opt_fold(in_stack_fffffffffffffd38);
        lVar9 = in_RDX;
      }
      (in_RDI->fold).ins.field_0.ot = 0x2a13;
      (in_RDI->fold).ins.field_0.op1 = 0x8000;
      (in_RDI->fold).ins.field_0.op2 = IVar2;
      TVar4 = lj_opt_fold(in_stack_fffffffffffffd38);
      TVar5 = lj_ir_kint((jit_State *)CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),
                         (int32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20));
      (in_RDI->fold).ins.field_0.ot = 0x2905;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar4;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
      TVar4 = lj_opt_fold(in_stack_fffffffffffffd38);
      for (local_1c8 = 0; local_1c8 < lVar9; local_1c8 = local_1c8 + 1) {
        pTVar1 = in_RDI->L->base;
        lVar10 = (local_1c8 + -1) - local_1b0;
        if ((&pTVar1->field_2)[lVar10].it < 0xfffeffff) {
          local_10 = 0xe;
        }
        else if ((int)(&pTVar1->field_2)[lVar10].it >> 0xf == -2) {
          local_10 = 3;
        }
        else {
          local_10 = (&pTVar1->field_2)[lVar10].it ^ 0xffffffff;
        }
        TVar5 = lj_ir_kint((jit_State *)
                           CONCAT26(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40),
                           (int32_t)((ulong)in_stack_fffffffffffffd38 >> 0x20));
        (in_RDI->fold).ins.field_0.ot = 0x3805;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar5;
        TVar5 = lj_opt_fold(in_stack_fffffffffffffd38);
        (in_RDI->fold).ins.field_0.ot = (ushort)local_10 | 0x4780;
        (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar5;
        (in_RDI->fold).ins.field_0.op2 = 0;
        local_1e0 = lj_opt_fold(in_stack_fffffffffffffd38);
        if (local_10 < 3) {
          local_1e0 = local_10 * 0xffffff + 0x7fff;
        }
        in_RDI->base[(ulong)in_ESI + local_1c8] = local_1e0;
      }
    }
    for (local_1c8 = local_1b0; local_1c8 < in_RDX; local_1c8 = local_1c8 + 1) {
      in_RDI->base[(ulong)in_ESI + local_1c8] = 0x7fff;
    }
    if ((in_RDX != 1) || (in_RDI->maxslot <= in_ESI)) {
      in_RDI->maxslot = in_ESI + (int)in_RDX;
    }
  }
  else {
    if (local_1b0 < 0) {
      local_1b0 = 0;
    }
    local_1a0 = in_RDX;
    if (in_RDX == 1) {
      if (in_RDI->maxslot <= in_ESI) {
        in_RDI->maxslot = in_ESI + 1;
      }
    }
    else {
      if (in_RDX == -1) {
        local_1a0 = local_1b0;
      }
      in_RDI->maxslot = in_ESI + (int)local_1a0;
    }
    if (0xf9 < in_RDI->baseslot + in_RDI->maxslot) {
      lj_trace_err((jit_State *)CONCAT26(in_stack_fffffffffffffd36,in_stack_fffffffffffffd30),e);
    }
    for (local_1b8 = 0; local_1b8 < local_1a0; local_1b8 = local_1b8 + 1) {
      if (local_1b8 < local_1b0) {
        if (in_RDI->base[(local_1b8 - local_1b0) + -1] == 0) {
          local_20c = sload((jit_State *)
                            CONCAT26(in_stack_fffffffffffffd36,in_stack_fffffffffffffd30),e);
        }
        else {
          local_20c = in_RDI->base[(local_1b8 - local_1b0) + -1];
        }
        local_210 = local_20c;
      }
      else {
        local_210 = 0x7fff;
      }
      in_RDI->base[(ulong)in_ESI + local_1b8] = local_210;
    }
  }
  return;
}

Assistant:

static void rec_varg(jit_State *J, BCReg dst, ptrdiff_t nresults)
{
  int32_t numparams = J->pt->numparams;
  ptrdiff_t nvararg = frame_delta(J->L->base-1) - numparams - 1 - LJ_FR2;
  lj_assertJ(frame_isvarg(J->L->base-1), "VARG in non-vararg frame");
  if (LJ_FR2 && dst > J->maxslot)
    J->base[dst-1] = 0;  /* Prevent resurrection of unrelated slot. */
  if (J->framedepth > 0) {  /* Simple case: varargs defined on-trace. */
    ptrdiff_t i;
    if (nvararg < 0) nvararg = 0;
    if (nresults != 1) {
      if (nresults == -1) nresults = nvararg;
      J->maxslot = dst + (BCReg)nresults;
    } else if (dst >= J->maxslot) {
      J->maxslot = dst + 1;
    }
    if (J->baseslot + J->maxslot >= LJ_MAX_JSLOTS)
      lj_trace_err(J, LJ_TRERR_STACKOV);
    for (i = 0; i < nresults; i++)
      J->base[dst+i] = i < nvararg ? getslot(J, i - nvararg - 1 - LJ_FR2) : TREF_NIL;
  } else {  /* Unknown number of varargs passed to trace. */
    TRef fr = emitir(IRTI(IR_SLOAD), LJ_FR2, IRSLOAD_READONLY|IRSLOAD_FRAME);
    int32_t frofs = 8*(1+LJ_FR2+numparams)+FRAME_VARG;
    if (nresults >= 0) {  /* Known fixed number of results. */
      ptrdiff_t i;
      if (nvararg > 0) {
	ptrdiff_t nload = nvararg >= nresults ? nresults : nvararg;
	TRef vbase;
	if (nvararg >= nresults)
	  emitir(IRTGI(IR_GE), fr, lj_ir_kint(J, frofs+8*(int32_t)nresults));
	else
	  emitir(IRTGI(IR_EQ), fr,
		 lj_ir_kint(J, (int32_t)frame_ftsz(J->L->base-1)));
	vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase, lj_ir_kint(J, frofs-8*(1+LJ_FR2)));
	for (i = 0; i < nload; i++) {
	  IRType t = itype2irt(&J->L->base[i-1-LJ_FR2-nvararg]);
	  TRef aref = emitir(IRT(IR_AREF, IRT_PGC),
			     vbase, lj_ir_kint(J, (int32_t)i));
	  TRef tr = emitir(IRTG(IR_VLOAD, t), aref, 0);
	  if (irtype_ispri(t)) tr = TREF_PRI(t);  /* Canonicalize primitives. */
	  J->base[dst+i] = tr;
	}
      } else {
	emitir(IRTGI(IR_LE), fr, lj_ir_kint(J, frofs));
	nvararg = 0;
      }
      for (i = nvararg; i < nresults; i++)
	J->base[dst+i] = TREF_NIL;
      if (nresults != 1 || dst >= J->maxslot) {
	J->maxslot = dst + (BCReg)nresults;
      }
    } else if (select_detect(J)) {  /* y = select(x, ...) */
      TRef tridx = getslot(J, dst-1);
      TRef tr = TREF_NIL;
      ptrdiff_t idx = lj_ffrecord_select_mode(J, tridx, &J->L->base[dst-1]);
      if (idx < 0) goto nyivarg;
      if (idx != 0 && !tref_isinteger(tridx)) {
	if (tref_isstr(tridx))
	  tridx = emitir(IRTG(IR_STRTO, IRT_NUM), tridx, 0);
	tridx = emitir(IRTGI(IR_CONV), tridx, IRCONV_INT_NUM|IRCONV_INDEX);
      }
      if (idx != 0 && tref_isk(tridx)) {
	emitir(IRTGI(idx <= nvararg ? IR_GE : IR_LT),
	       fr, lj_ir_kint(J, frofs+8*(int32_t)idx));
	frofs -= 8;  /* Bias for 1-based index. */
      } else if (idx <= nvararg) {  /* Compute size. */
	TRef tmp = emitir(IRTI(IR_ADD), fr, lj_ir_kint(J, -frofs));
	if (numparams)
	  emitir(IRTGI(IR_GE), tmp, lj_ir_kint(J, 0));
	tr = emitir(IRTI(IR_BSHR), tmp, lj_ir_kint(J, 3));
	if (idx != 0) {
	  tridx = emitir(IRTI(IR_ADD), tridx, lj_ir_kint(J, -1));
	  rec_idx_abc(J, tr, tridx, (uint32_t)nvararg);
	}
      } else {
	TRef tmp = lj_ir_kint(J, frofs);
	if (idx != 0) {
	  TRef tmp2 = emitir(IRTI(IR_BSHL), tridx, lj_ir_kint(J, 3));
	  tmp = emitir(IRTI(IR_ADD), tmp2, tmp);
	} else {
	  tr = lj_ir_kint(J, 0);
	}
	emitir(IRTGI(IR_LT), fr, tmp);
      }
      if (idx != 0 && idx <= nvararg) {
	IRType t;
	TRef aref, vbase = emitir(IRT(IR_SUB, IRT_IGC), REF_BASE, fr);
	vbase = emitir(IRT(IR_ADD, IRT_PGC), vbase,
		       lj_ir_kint(J, frofs-(8<<LJ_FR2)));
	t = itype2irt(&J->L->base[idx-2-LJ_FR2-nvararg]);
	aref = emitir(IRT(IR_AREF, IRT_PGC), vbase, tridx);
	tr = emitir(IRTG(IR_VLOAD, t), aref, 0);
	if (irtype_ispri(t)) tr = TREF_PRI(t);  /* Canonicalize primitives. */
      }
      J->base[dst-2-LJ_FR2] = tr;
      J->maxslot = dst-1-LJ_FR2;
      J->bcskip = 2;  /* Skip CALLM + select. */
    } else {
    nyivarg:
      setintV(&J->errinfo, BC_VARG);
      lj_trace_err_info(J, LJ_TRERR_NYIBC);
    }
  }
}